

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.hpp
# Opt level: O0

char * __thiscall vkt::sr::LineStream::str(LineStream *this)

{
  char *pcVar1;
  string local_30 [32];
  LineStream *local_10;
  LineStream *this_local;
  
  local_10 = this;
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)&this->m_string,local_30);
  std::__cxx11::string::~string(local_30);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  return pcVar1;
}

Assistant:

const char*			str				(void) const		{ m_string = m_stream.str(); return m_string.c_str(); }